

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

void __thiscall QSynth::~QSynth(QSynth *this)

{
  SampleRateConverter *this_00;
  Synth *this_01;
  QMutex *pQVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR_metaObject_001c9298;
  freeROMImages(this);
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    (**(code **)(*(long *)this->realtimeHelper + 0x20))();
  }
  if (this->audioRecorder != (AudioFileWriter *)0x0) {
    (*this->audioRecorder->_vptr_AudioFileWriter[1])();
  }
  this_00 = this->sampleRateConverter;
  if (this_00 != (SampleRateConverter *)0x0) {
    MT32Emu::SampleRateConverter::~SampleRateConverter(this_00);
    operator_delete(this_00,0x18);
  }
  this_01 = this->synth;
  if (this_01 != (Synth *)0x0) {
    MT32Emu::Synth::~Synth(this_01);
    operator_delete(this_01,0x101e8);
  }
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    QMutex::~QMutex(pQVar1);
    operator_delete(pQVar1,8);
  }
  pQVar1 = this->midiMutex;
  if (pQVar1 != (QMutex *)0x0) {
    QMutex::~QMutex(pQVar1);
    operator_delete(pQVar1,8);
  }
  pDVar2 = (this->synthProfileName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->synthProfileName).d.d)->super_QArrayData,2,8);
    }
  }
  QObject::~QObject(&(this->reportHandler).super_QObject);
  pDVar2 = (this->pcmROMFileName2).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->pcmROMFileName2).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar2 = (this->pcmROMFileName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->pcmROMFileName).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar2 = (this->controlROMFileName2).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->controlROMFileName2).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar2 = (this->controlROMFileName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->controlROMFileName).d.d)->super_QArrayData,2,8);
    }
  }
  QDir::~QDir(&this->romDir);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSynth::~QSynth() {
	freeROMImages();
	delete realtimeHelper;
	delete audioRecorder;
	delete sampleRateConverter;
	delete synth;
	delete synthMutex;
	delete midiMutex;
}